

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O2

Error asmjit::X86Logging_formatImmText
                (StringBuilder *sb,uint32_t u8,uint32_t bits,uint32_t advance,char *text,
                uint32_t count)

{
  char cVar1;
  Error EVar2;
  int iVar3;
  char *str;
  uint32_t i;
  uint32_t uVar4;
  int iVar5;
  
  EVar2 = StringBuilder::_opChar(sb,1,'<');
  if (EVar2 != 0) {
    return EVar2;
  }
  iVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if (uVar4 == count) {
      EVar2 = StringBuilder::_opChar(sb,1,'>');
      return EVar2;
    }
    if ((uVar4 != 0) && (EVar2 = StringBuilder::_opChar(sb,1,'|'), EVar2 != 0)) break;
    str = text;
    for (iVar3 = 0; iVar3 != (u8 & ~(-1 << (bits & 0x1f))) + iVar5; iVar3 = iVar3 + 1) {
      do {
        cVar1 = *str;
        str = str + 1;
      } while (cVar1 != '\0');
    }
    EVar2 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
    if (EVar2 != 0) {
      return EVar2;
    }
    iVar5 = iVar5 + advance;
    uVar4 = uVar4 + 1;
    u8 = u8 >> (bits & 0x1f);
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmText(StringBuilder& sb, uint32_t u8, uint32_t bits, uint32_t advance, const char* text, uint32_t count = 1) noexcept {
  ASMJIT_PROPAGATE(sb.appendChar('<'));

  uint32_t mask = (1 << bits) - 1;
  uint32_t pos = 0;

  for (uint32_t i = 0; i < count; i++, u8 >>= bits, pos += advance) {
    uint32_t value = (u8 & mask) + pos;
    if (i != 0)
      ASMJIT_PROPAGATE(sb.appendChar('|'));
    ASMJIT_PROPAGATE(sb.appendString(Utils::findPackedString(text, value)));
  }

  return sb.appendChar('>');
}